

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall
HModel::util_extractCols
          (HModel *this,int firstcol,int lastcol,double *XcolLower,double *XcolUpper,int *nnonz,
          int *XAstart,int *XAindex,double *XAvalue)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  long lVar7;
  int iVar8;
  
  printf("Called model.util_extractCols(firstcol=%d, lastcol=%d)\n");
  std::ostream::flush();
  piVar3 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = piVar3 + firstcol;
  iVar2 = *piVar1;
  if (firstcol <= lastcol) {
    pdVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      XcolLower[lVar7] = pdVar4[firstcol + lVar7];
      XcolUpper[lVar7] = pdVar5[firstcol + lVar7];
      XAstart[lVar7] = piVar1[lVar7] - iVar2;
      lVar7 = lVar7 + 1;
    } while ((lastcol - firstcol) + 1 != (int)lVar7);
  }
  lVar7 = (long)*piVar1;
  iVar8 = piVar3[(long)lastcol + 1];
  if (*piVar1 < iVar8) {
    piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      XAindex[lVar7 - iVar2] = piVar6[lVar7];
      XAvalue[lVar7 - iVar2] = pdVar4[lVar7];
      lVar7 = lVar7 + 1;
      iVar8 = piVar3[(long)lastcol + 1];
    } while (lVar7 < iVar8);
  }
  *nnonz = iVar8 - iVar2;
  return;
}

Assistant:

void HModel::util_extractCols(int firstcol, int lastcol, double* XcolLower, double* XcolUpper,
			  int* nnonz, int* XAstart, int* XAindex, double* XAvalue) {
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  assert(firstcol <= lastcol);
#ifdef JAJH_dev
  printf("Called model.util_extractCols(firstcol=%d, lastcol=%d)\n", firstcol, lastcol);cout << flush;
#endif
  //Determine the number of columns to be extracted
  //int numExtractCols = lastcol-firstcol+1;
  //printf("Extracting %d columns\n", numExtractCols);cout << flush;
  int elOs = Astart[firstcol];
  for (int col = firstcol; col <= lastcol; col++) {
    //    printf("Extracting column %d\n", col);cout << flush;
    XcolLower[col-firstcol] = colLower[col];
    XcolUpper[col-firstcol] = colUpper[col];
    XAstart[col-firstcol] = Astart[col]-elOs;
  }
  for (int el = Astart[firstcol]; el < Astart[lastcol+1]; el++) {
    XAindex[el-elOs] = Aindex[el];
    XAvalue[el-elOs] = Avalue[el];
  }
  *nnonz = Astart[lastcol+1]-elOs;
}